

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O2

bool __thiscall Diligent::StandardFile::Write(StandardFile *this,void *Data,size_t Size)

{
  size_t sVar1;
  FILE *__s;
  string msg;
  
  __s = (FILE *)this->m_pFile;
  if (__s == (FILE *)0x0) {
    FormatString<char[19]>(&msg,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Write",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x4f);
    std::__cxx11::string::~string((string *)&msg);
    __s = (FILE *)this->m_pFile;
    if (__s == (FILE *)0x0) {
      return false;
    }
  }
  sVar1 = fwrite(Data,1,Size,__s);
  return sVar1 == Size;
}

Assistant:

bool StandardFile::Write(const void* Data, size_t Size)
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return false;
    auto BytesWritten = fwrite(Data, 1, Size, m_pFile);

    return BytesWritten == Size;
}